

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

void __thiscall QTextMarkdownImporter::insertBlock(QTextMarkdownImporter *this)

{
  bool bVar1;
  QTextBlock *block;
  QTextList *in_RDI;
  long in_FS_OFFSET;
  QTextList *list;
  QTextBlockFormat blockFormat;
  QTextCharFormat charFormat;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  QTextFormat *in_stack_fffffffffffffeb0;
  QTextList *in_stack_fffffffffffffeb8;
  QTextFormat *in_stack_fffffffffffffec0;
  QTextFormat *in_stack_fffffffffffffed0;
  QTextFormat *pQVar2;
  QTextList *this_00;
  QLatin1Char local_10b;
  QChar local_10a;
  Data *in_stack_fffffffffffffef8;
  QDebug local_d0 [9];
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0xa00bb6);
  bVar1 = QList<QTextCharFormat>::isEmpty((QList<QTextCharFormat> *)0xa00bc4);
  if (!bVar1) {
    QStack<QTextCharFormat>::top((QStack<QTextCharFormat> *)0xa00bd6);
    QTextCharFormat::operator=
              ((QTextCharFormat *)in_stack_fffffffffffffeb0,
               (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0xa00c11);
  bVar1 = QList<QPointer<QTextList>_>::isEmpty((QList<QPointer<QTextList>_> *)0xa00c1f);
  if (((!bVar1) && ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x5 & 1) == 0)) &&
     ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x6 & 1) != 0)) {
    QStack<QPointer<QTextList>_>::top((QStack<QPointer<QTextList>_> *)0xa00c59);
    in_stack_fffffffffffffed0 =
         (QTextFormat *)::QPointer::operator_cast_to_QTextList_((QPointer<QTextList> *)0xa00c61);
    if (in_stack_fffffffffffffed0 == (QTextFormat *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_fffffffffffffef8);
      QDebug::~QDebug(local_d0);
    }
    else {
      pQVar2 = in_stack_fffffffffffffed0;
      QTextList::count((QTextList *)in_stack_fffffffffffffeb0);
      QTextList::item(in_RDI,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffed0);
      QTextBlockFormat::operator=
                ((QTextBlockFormat *)in_stack_fffffffffffffeb0,
                 (QTextBlockFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0xa00cd0);
      in_stack_fffffffffffffec0 = in_stack_fffffffffffffed0;
      in_stack_fffffffffffffed0 = pQVar2;
    }
  }
  if (*(int *)&in_RDI[10].super_QTextBlockGroup.super_QTextObject.field_0xc != 0) {
    ::QVariant::QVariant
              (&local_28,*(int *)&in_RDI[10].super_QTextBlockGroup.super_QTextObject.field_0xc);
    QTextFormat::setProperty
              (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (QVariant *)in_stack_fffffffffffffeb0);
    ::QVariant::~QVariant(&local_28);
    QTextBlockFormat::setLeftMargin
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,(qreal)in_stack_fffffffffffffeb0);
    QTextBlockFormat::setRightMargin
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,(qreal)in_stack_fffffffffffffeb0);
  }
  if ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x7 & 1) == 0) {
    QTextBlockFormat::setTopMargin
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,(qreal)in_stack_fffffffffffffeb0);
    QTextBlockFormat::setBottomMargin
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,(qreal)in_stack_fffffffffffffeb0);
  }
  else {
    ::QVariant::QVariant
              (&local_48,(QString *)&in_RDI[2].super_QTextBlockGroup.super_QTextObject.field_0x8);
    QTextFormat::setProperty
              (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (QVariant *)in_stack_fffffffffffffeb0);
    ::QVariant::~QVariant(&local_48);
    if (in_RDI[0xc].super_QTextBlockGroup.super_QTextObject.field_0x4 != '\0') {
      QTextBlockFormat::setNonBreakableLines
                ((QTextBlockFormat *)in_stack_fffffffffffffeb8,
                 SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
      QLatin1Char::QLatin1Char
                (&local_10b,in_RDI[0xc].super_QTextBlockGroup.super_QTextObject.field_0x4);
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffffeb0,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
      QString::QString((QString *)&stack0xfffffffffffffef8,local_10a);
      ::QVariant::QVariant(&local_68,(QString *)&stack0xfffffffffffffef8);
      QTextFormat::setProperty
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (QVariant *)in_stack_fffffffffffffeb0);
      ::QVariant::~QVariant(&local_68);
      QString::~QString((QString *)0xa00e83);
    }
    QTextCharFormat::setFont
              ((QTextCharFormat *)this_00,(QFont *)in_stack_fffffffffffffed0,
               (FontPropertiesInheritanceBehavior)((ulong)in_RDI >> 0x20));
  }
  if (*(int *)&in_RDI[0xf].super_QTextBlockGroup.super_QTextObject == 0) {
    QTextFormat::clearProperty(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  else {
    QTextBlockFormat::setMarker
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,
               (MarkerType)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  }
  bVar1 = QList<QPointer<QTextList>_>::isEmpty((QList<QPointer<QTextList>_> *)0xa00f1f);
  if (!bVar1) {
    QList<QPointer<QTextList>_>::size
              ((QList<QPointer<QTextList>_> *)
               &in_RDI[5].super_QTextBlockGroup.super_QTextObject.field_0x8);
    QTextBlockFormat::setIndent
              ((QTextBlockFormat *)in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  }
  QTextCursor::document
            ((QTextCursor *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar1 = QTextDocument::isEmpty((QTextDocument *)in_stack_fffffffffffffeb0);
  if (bVar1) {
    QTextCursor::setBlockFormat
              ((QTextCursor *)in_stack_fffffffffffffeb0,
               (QTextBlockFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QTextCursor::setCharFormat
              ((QTextCursor *)in_stack_fffffffffffffec0,(QTextCharFormat *)in_stack_fffffffffffffeb8
              );
  }
  else if ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x6 & 1) == 0) {
    QTextCursor::insertBlock
              ((QTextCursor *)in_stack_fffffffffffffeb8,
               (QTextBlockFormat *)in_stack_fffffffffffffeb0,
               (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)0xa00f99);
    QTextCursor::insertBlock
              ((QTextCursor *)in_stack_fffffffffffffeb8,
               (QTextBlockFormat *)in_stack_fffffffffffffeb0,
               (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0xa00fc0);
    QTextCursor::setCharFormat
              ((QTextCursor *)in_stack_fffffffffffffec0,(QTextCharFormat *)in_stack_fffffffffffffeb8
              );
  }
  if ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x5 & 1) == 0) {
    bVar1 = QList<QPointer<QTextList>_>::isEmpty((QList<QPointer<QTextList>_> *)0xa01054);
    if ((!bVar1) && ((in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x6 & 1) != 0)) {
      QStack<QPointer<QTextList>_>::top((QStack<QPointer<QTextList>_> *)0xa01074);
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTextList> *)0xa0107c);
      if (bVar1) {
        QStack<QPointer<QTextList>_>::top((QStack<QPointer<QTextList>_> *)0xa01090);
        block = (QTextBlock *)QPointer<QTextList>::operator->((QPointer<QTextList> *)0xa01098);
        QTextCursor::block((QTextCursor *)in_stack_fffffffffffffeb8);
        QTextList::add(in_stack_fffffffffffffeb8,block);
      }
    }
  }
  else {
    QTextCursor::createList
              ((QTextCursor *)in_stack_fffffffffffffec0,
               (QTextListFormat *)&in_RDI[5].super_QTextBlockGroup.super_QTextObject.field_0x8);
    QPointer<QTextList>::QPointer<void>
              ((QPointer<QTextList> *)in_stack_fffffffffffffeb0,
               (QTextList *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QStack<QPointer<QTextList>_>::push
              ((QStack<QPointer<QTextList>_> *)in_stack_fffffffffffffeb0,
               (QPointer<QTextList> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
    ;
    QPointer<QTextList>::~QPointer((QPointer<QTextList> *)0xa01044);
  }
  in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x5 = 0;
  in_RDI[0xf].super_QTextBlockGroup.super_QTextObject.field_0x4 = 0;
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0xa010e3);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0xa010f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextMarkdownImporter::insertBlock()
{
    QTextCharFormat charFormat;
    if (!m_spanFormatStack.isEmpty())
        charFormat = m_spanFormatStack.top();
    QTextBlockFormat blockFormat;
    if (!m_listStack.isEmpty() && !m_needsInsertList && m_listItem) {
        QTextList *list = m_listStack.top();
        if (list)
            blockFormat = list->item(list->count() - 1).blockFormat();
        else
            qWarning() << "attempted to insert into a list that no longer exists";
    }
    if (m_blockQuoteDepth) {
        blockFormat.setProperty(QTextFormat::BlockQuoteLevel, m_blockQuoteDepth);
        blockFormat.setLeftMargin(qtmi_BlockQuoteIndent * m_blockQuoteDepth);
        blockFormat.setRightMargin(qtmi_BlockQuoteIndent);
    }
    if (m_codeBlock) {
        blockFormat.setProperty(QTextFormat::BlockCodeLanguage, m_blockCodeLanguage);
        if (m_blockCodeFence) {
            blockFormat.setNonBreakableLines(true);
            blockFormat.setProperty(QTextFormat::BlockCodeFence, QString(QLatin1Char(m_blockCodeFence)));
        }
        charFormat.setFont(m_monoFont);
    } else {
        blockFormat.setTopMargin(m_paragraphMargin);
        blockFormat.setBottomMargin(m_paragraphMargin);
    }
    if (m_markerType == QTextBlockFormat::MarkerType::NoMarker)
        blockFormat.clearProperty(QTextFormat::BlockMarker);
    else
        blockFormat.setMarker(m_markerType);
    if (!m_listStack.isEmpty())
        blockFormat.setIndent(m_listStack.size());
    if (m_cursor.document()->isEmpty()) {
        m_cursor.setBlockFormat(blockFormat);
        m_cursor.setCharFormat(charFormat);
    } else if (m_listItem) {
        m_cursor.insertBlock(blockFormat, QTextCharFormat());
        m_cursor.setCharFormat(charFormat);
    } else {
        m_cursor.insertBlock(blockFormat, charFormat);
    }
    if (m_needsInsertList) {
        m_listStack.push(m_cursor.createList(m_listFormat));
    } else if (!m_listStack.isEmpty() && m_listItem && m_listStack.top()) {
        m_listStack.top()->add(m_cursor.block());
    }
    m_needsInsertList = false;
    m_needsInsertBlock = false;
}